

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall node::anon_unknown_2::RpcHandlerImpl::~RpcHandlerImpl(RpcHandlerImpl *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~RpcHandlerImpl(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x90);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RpcHandlerImpl() override { disconnect(); }